

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.hpp
# Opt level: O2

shared_ptr<utils::detail::shared_ptr_continer> __thiscall
utils::detail::weak_ptr_continer_imp<std::weak_ptr<subject>_>::lock
          (weak_ptr_continer_imp<std::weak_ptr<subject>_> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<utils::detail::shared_ptr_continer> sVar2;
  __shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  shared_ptr<subject> local_28;
  
  std::__shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_38,in_RSI + 8);
  std::
  make_shared<utils::detail::shared_ptr_continer_imp<std::shared_ptr<subject>>,std::shared_ptr<subject>>
            (&local_28);
  _Var1._M_pi = local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_weak_ptr_continer)._vptr_weak_ptr_continer =
       (_func_int **)local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_weak).super___weak_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<subject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  sVar2.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<utils::detail::shared_ptr_continer>)
         sVar2.super___shared_ptr<utils::detail::shared_ptr_continer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<shared_ptr_continer> lock() const
    {
        using SharedPtrType = typename smart_ptr_traits<WeakPtrType>::share_type;
        return std::make_shared<shared_ptr_continer_imp<SharedPtrType>>(m_weak.lock());
    }